

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  QFileDevicePrivate *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  FileError FVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int __oflag_00;
  FileError err;
  char *__file_00;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  bVar1 = QIODevice::isOpen((QIODevice *)this);
  if (bVar1) {
    iVar3 = 0;
    file_already_open(this,(char *)0x0);
  }
  else {
    __file_00 = (char *)(ulong)((uint)__file | 2);
    if (((ulong)__file & 0x44) == 0) {
      __file_00 = (char *)((ulong)__file & 0xffffffff);
    }
    QFileDevice::unsetError(&this->super_QFileDevice);
    if (((ulong)__file_00 & 3) == 0) {
      local_48.context.version = 2;
      local_48.context.function._4_4_ = 0;
      local_48.context._4_8_ = 0;
      local_48.context._12_8_ = 0;
      local_48.context.category = "default";
      iVar3 = 0;
      QMessageLogger::warning(&local_48,"QIODevice::open: File access not specified");
    }
    else {
      iVar3 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
                _vptr_QObjectData[7])(this_00);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar3),(uint)__file_00 | 0x20,0);
      if (cVar2 == '\0') {
        FVar5 = QAbstractFileEngine::error
                          ((QAbstractFileEngine *)
                           (this_00->fileEngine)._M_t.
                           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                           .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
        err = OpenError;
        if (FVar5 != UnspecifiedError) {
          err = FVar5;
        }
        QAbstractFileEngine::errorString
                  ((QString *)&local_48,
                   (QAbstractFileEngine *)
                   (this_00->fileEngine)._M_t.
                   super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                   .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
        QFileDevicePrivate::setError(this_00,err,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
        iVar3 = 0;
      }
      else {
        QIODevice::open((QIODevice *)this,__file_00,__oflag_00);
        iVar3 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
        if (((ulong)__file_00 & 4) != 0) {
          iVar4 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x10])
                            (this);
          (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x11])
                    (this,CONCAT44(extraout_var_00,iVar4));
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFile::open(OpenMode mode)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QIODevice::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so there's no need to request it from the file engine.
    if (d->engine()->open(mode | QIODevice::Unbuffered)) {
        QIODevice::open(mode);
        if (mode & Append)
            seek(size());
        return true;
    }
    QFile::FileError err = d->fileEngine->error();
    if (err == QFile::UnspecifiedError)
        err = QFile::OpenError;
    d->setError(err, d->fileEngine->errorString());
    return false;
}